

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall
CVmObjTable::save_image_pointer(CVmObjTable *this,vm_obj_id_t obj_id,char *ptr,size_t siz)

{
  size_t sVar1;
  vm_image_ptr_page *pvVar2;
  
  if (this->image_ptr_head_ == (vm_image_ptr_page *)0x0) {
    pvVar2 = (vm_image_ptr_page *)malloc(0x2588);
    this->image_ptr_head_ = pvVar2;
    if (pvVar2 == (vm_image_ptr_page *)0x0) {
LAB_0027adaf:
      err_throw(0xca);
    }
    this->image_ptr_tail_ = pvVar2;
    pvVar2->next_ = (vm_image_ptr_page *)0x0;
  }
  else {
    if (this->image_ptr_last_cnt_ != 400) goto LAB_0027ad86;
    pvVar2 = (vm_image_ptr_page *)malloc(0x2588);
    this->image_ptr_tail_->next_ = pvVar2;
    pvVar2 = this->image_ptr_tail_->next_;
    if (pvVar2 == (vm_image_ptr_page *)0x0) goto LAB_0027adaf;
    this->image_ptr_tail_ = pvVar2;
    pvVar2->next_ = (vm_image_ptr_page *)0x0;
  }
  this->image_ptr_last_cnt_ = 0;
LAB_0027ad86:
  pvVar2 = this->image_ptr_tail_;
  sVar1 = this->image_ptr_last_cnt_;
  pvVar2->ptrs_[sVar1].obj_id_ = obj_id;
  pvVar2->ptrs_[sVar1].image_data_ptr_ = ptr;
  pvVar2->ptrs_[sVar1].image_data_len_ = siz;
  this->image_ptr_last_cnt_ = this->image_ptr_last_cnt_ + 1;
  return;
}

Assistant:

void CVmObjTable::save_image_pointer(vm_obj_id_t obj_id, const char *ptr,
                                     size_t siz)
{
    vm_image_ptr *slot;
    
    /* allocate a new page if we're out of slots on the current page */
    if (image_ptr_head_ == 0)
    {
        /* no pages yet - allocate the first page */
        image_ptr_head_ = (vm_image_ptr_page *)
                          t3malloc(sizeof(vm_image_ptr_page));
        if (image_ptr_head_ == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* it's also the last page */
        image_ptr_tail_ = image_ptr_head_;
        image_ptr_tail_->next_ = 0;

        /* no slots used on this page yet */
        image_ptr_last_cnt_ = 0;
    }
    else if (image_ptr_last_cnt_ == VM_IMAGE_PTRS_PER_PAGE)
    {
        /* the last page is full - allocate another one */
        image_ptr_tail_->next_ = (vm_image_ptr_page *)
                                 t3malloc(sizeof(vm_image_ptr_page));
        if (image_ptr_tail_->next_ == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* it's the new last page */
        image_ptr_tail_ = image_ptr_tail_->next_;
        image_ptr_tail_->next_ = 0;

        /* no slots used on this page yet */
        image_ptr_last_cnt_ = 0;
    }

    /* get the next available slot */
    slot = &image_ptr_tail_->ptrs_[image_ptr_last_cnt_];

    /* save the data */
    slot->obj_id_ = obj_id;
    slot->image_data_ptr_ = ptr;
    slot->image_data_len_ = siz;

    /* count the new record */
    ++image_ptr_last_cnt_;
}